

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAcurv::NodeIntStateGather
          (ChNodeFEAcurv *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  Index index_2;
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((long)(ulong)off_x <=
      (x->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
    pdVar1 = (x->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + off_x
    ;
    uVar2 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
      uVar2 = uVar3;
    }
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        pdVar1[uVar3] = *(double *)((long)(&this->m_ryy + -1) + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    if (uVar2 < 3) {
      do {
        pdVar1[uVar2] = *(double *)((long)(&this->m_ryy + -1) + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (uVar2 != 3);
    }
    if ((long)(ulong)(off_x + 3) <=
        (x->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
      pdVar1 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               (off_x + 3);
      uVar2 = 3;
      if ((((ulong)pdVar1 & 7) == 0) &&
         (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
        uVar2 = uVar3;
      }
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          pdVar1[uVar3] = (this->m_ryy).m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      if (uVar2 < 3) {
        do {
          pdVar1[uVar2] = (this->m_ryy).m_data[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar2 != 3);
      }
      if ((long)(ulong)(off_x + 6) <=
          (x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
        pdVar1 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 (off_x + 6);
        uVar2 = 3;
        if ((((ulong)pdVar1 & 7) == 0) &&
           (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
          uVar2 = uVar3;
        }
        if (uVar2 != 0) {
          uVar3 = 0;
          do {
            pdVar1[uVar3] = (this->m_rzz).m_data[uVar3];
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
        if (uVar2 < 3) {
          do {
            pdVar1[uVar2] = (this->m_rzz).m_data[uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar2 != 3);
        }
        if ((long)(ulong)off_v <=
            (v->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
          pdVar1 = (v->super_ChVectorDynamic<double>).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   off_v;
          uVar2 = 3;
          if ((((ulong)pdVar1 & 7) == 0) &&
             (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
            uVar2 = uVar3;
          }
          if (uVar2 != 0) {
            uVar3 = 0;
            do {
              pdVar1[uVar3] = (this->m_rxx_dt).m_data[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar2 != uVar3);
          }
          if (uVar2 < 3) {
            do {
              pdVar1[uVar2] = (this->m_rxx_dt).m_data[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar2 != 3);
          }
          if ((long)(ulong)(off_v + 3) <=
              (v->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)
          {
            pdVar1 = (v->super_ChVectorDynamic<double>).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     + (off_v + 3);
            uVar2 = 3;
            if ((((ulong)pdVar1 & 7) == 0) &&
               (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
              uVar2 = uVar3;
            }
            if (uVar2 != 0) {
              uVar3 = 0;
              do {
                pdVar1[uVar3] = (this->m_ryy_dt).m_data[uVar3];
                uVar3 = uVar3 + 1;
              } while (uVar2 != uVar3);
            }
            if (uVar2 < 3) {
              do {
                pdVar1[uVar2] = (this->m_ryy_dt).m_data[uVar2];
                uVar2 = uVar2 + 1;
              } while (uVar2 != 3);
            }
            if ((long)(ulong)(off_v + 6) <=
                (v->super_ChVectorDynamic<double>).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3
               ) {
              pdVar1 = (v->super_ChVectorDynamic<double>).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data + (off_v + 6);
              uVar2 = 3;
              if ((((ulong)pdVar1 & 7) == 0) &&
                 (uVar3 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar3 < 3)) {
                uVar2 = uVar3;
              }
              if (uVar2 != 0) {
                uVar3 = 0;
                do {
                  pdVar1[uVar3] = (this->m_rzz_dt).m_data[uVar3];
                  uVar3 = uVar3 + 1;
                } while (uVar2 != uVar3);
              }
              if (uVar2 < 3) {
                do {
                  pdVar1[uVar2] = (this->m_rzz_dt).m_data[uVar2];
                  uVar2 = uVar2 + 1;
                } while (uVar2 != 3);
              }
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAcurv::NodeIntStateGather(const unsigned int off_x,
                                       ChState& x,
                                       const unsigned int off_v,
                                       ChStateDelta& v,
                                       double& T) {
    x.segment(off_x + 0, 3) = m_rxx.eigen();
    x.segment(off_x + 3, 3) = m_ryy.eigen();
    x.segment(off_x + 6, 3) = m_rzz.eigen();

    v.segment(off_v + 0, 3) = m_rxx_dt.eigen();
    v.segment(off_v + 3, 3) = m_ryy_dt.eigen();
    v.segment(off_v + 6, 3) = m_rzz_dt.eigen();
}